

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptAsyncGenerator * __thiscall
Js::JavascriptLibrary::CreateAsyncGenerator
          (JavascriptLibrary *this,Arguments *args,ScriptFunction *scriptFunction,
          RecyclableObject *prototype)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar3;
  Recycler *recycler;
  DynamicType *generatorType;
  JavascriptAsyncGenerator *pJVar4;
  RecyclableObject *prototype_local;
  ScriptFunction *scriptFunction_local;
  Arguments *args_local;
  JavascriptLibrary *this_local;
  
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1854,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  recycler = GetRecycler(this);
  generatorType = CreateAsyncGeneratorType(this,prototype);
  pJVar4 = JavascriptAsyncGenerator::New(recycler,generatorType,args,scriptFunction);
  return pJVar4;
}

Assistant:

JavascriptAsyncGenerator* JavascriptLibrary::CreateAsyncGenerator(
        Arguments& args,
        ScriptFunction* scriptFunction,
        RecyclableObject* prototype)
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());
        return JavascriptAsyncGenerator::New(
            GetRecycler(),
            CreateAsyncGeneratorType(prototype),
            args,
            scriptFunction);
    }